

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O2

QRectF * __thiscall QRectF::operator|(QRectF *this,QRectF *r)

{
  double dVar1;
  QRectF *in_RDI;
  qreal qVar2;
  double dVar3;
  qreal qVar4;
  qreal qVar5;
  double dVar6;
  qreal qVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar8 = this->w;
  dVar10 = this->h;
  if ((((dVar8 != 0.0) || (NAN(dVar8))) || (dVar10 != 0.0)) || (NAN(dVar10))) {
    dVar6 = r->w;
    dVar1 = r->h;
    if (((dVar6 != 0.0) || (NAN(dVar6))) || ((dVar1 != 0.0 || (NAN(dVar1))))) {
      dVar3 = this->xp;
      dVar9 = dVar3;
      if (0.0 <= dVar8) {
        dVar9 = dVar8 + dVar3;
      }
      dVar3 = (double)(~-(ulong)(dVar8 < 0.0) & (ulong)dVar3 |
                      (ulong)(dVar8 + dVar3) & -(ulong)(dVar8 < 0.0));
      dVar8 = r->xp;
      if (0.0 <= dVar6) {
        if (dVar8 <= dVar3) {
          dVar3 = dVar8;
        }
        dVar8 = dVar8 + dVar6;
      }
      else if (dVar6 + dVar8 <= dVar3) {
        dVar3 = dVar6 + dVar8;
      }
      dVar6 = this->yp;
      dVar11 = dVar10 + dVar6;
      if (0.0 <= dVar10) {
        dVar11 = dVar6;
      }
      if (dVar8 <= dVar9) {
        dVar8 = dVar9;
      }
      dVar6 = (double)(-(ulong)(dVar10 < 0.0) & (ulong)dVar6 |
                      ~-(ulong)(dVar10 < 0.0) & (ulong)(dVar10 + dVar6));
      dVar10 = r->yp;
      if (0.0 <= dVar1) {
        if (dVar10 <= dVar11) {
          dVar11 = dVar10;
        }
        dVar10 = dVar10 + dVar1;
      }
      else if (dVar1 + dVar10 <= dVar11) {
        dVar11 = dVar1 + dVar10;
      }
      if (dVar10 <= dVar6) {
        dVar10 = dVar6;
      }
      in_RDI->xp = dVar3;
      in_RDI->yp = dVar11;
      in_RDI->w = dVar8 - dVar3;
      in_RDI->h = dVar10 - dVar11;
      return in_RDI;
    }
    qVar2 = this->xp;
    qVar4 = this->yp;
    qVar5 = this->w;
    qVar7 = this->h;
  }
  else {
    qVar2 = r->xp;
    qVar4 = r->yp;
    qVar5 = r->w;
    qVar7 = r->h;
  }
  in_RDI->w = qVar5;
  in_RDI->h = qVar7;
  in_RDI->xp = qVar2;
  in_RDI->yp = qVar4;
  return in_RDI;
}

Assistant:

QRectF QRectF::operator|(const QRectF &r) const noexcept
{
    if (isNull())
        return r;
    if (r.isNull())
        return *this;

    qreal left = xp;
    qreal right = xp;
    if (w < 0)
        left += w;
    else
        right += w;

    if (r.w < 0) {
        left = qMin(left, r.xp + r.w);
        right = qMax(right, r.xp);
    } else {
        left = qMin(left, r.xp);
        right = qMax(right, r.xp + r.w);
    }

    qreal top = yp;
    qreal bottom = yp;
    if (h < 0)
        top += h;
    else
        bottom += h;

    if (r.h < 0) {
        top = qMin(top, r.yp + r.h);
        bottom = qMax(bottom, r.yp);
    } else {
        top = qMin(top, r.yp);
        bottom = qMax(bottom, r.yp + r.h);
    }

    return QRectF(left, top, right - left, bottom - top);
}